

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

char * get_button_name(int button)

{
  char *pcStack_10;
  int button_local;
  
  if (button == 0) {
    pcStack_10 = "left";
  }
  else if (button == 1) {
    pcStack_10 = "right";
  }
  else if (button == 2) {
    pcStack_10 = "middle";
  }
  else {
    snprintf(get_button_name::name,0x10,"%i",(ulong)(uint)button);
    pcStack_10 = get_button_name::name;
  }
  return pcStack_10;
}

Assistant:

static const char* get_button_name(int button)
{
    switch (button)
    {
        case GLFW_MOUSE_BUTTON_LEFT:
            return "left";
        case GLFW_MOUSE_BUTTON_RIGHT:
            return "right";
        case GLFW_MOUSE_BUTTON_MIDDLE:
            return "middle";
        default:
        {
            static char name[16];
            snprintf(name, sizeof(name), "%i", button);
            return name;
        }
    }
}